

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_remote.c
# Opt level: O1

int remoteSync(mpt_output *out,int timeout)

{
  _mpt_vptr_output *p_Var1;
  mpt_stream *srm;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  _func_int_mpt_output_ptr__func_int_void_ptr_mpt_message_ptr_ptr_void_ptr **pp_Var7;
  ulong uVar8;
  byte *pbVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  int unaff_R12D;
  ulong uVar13;
  bool bVar14;
  uint64_t ansid;
  pollfd p;
  char *local_68;
  mpt_output *local_60;
  mpt_outdata *local_58;
  pollfd local_50;
  byte *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  uVar8 = (ulong)*(byte *)((long)&out[4]._vptr + 5);
  if (uVar8 == 0) {
    unaff_R12D = 0;
  }
  else {
    local_58 = (mpt_outdata *)(out + 3);
    if (*(int *)&out[4]._vptr < 0) {
      srm = (mpt_stream *)(local_58->buf)._buf;
      if (srm != (mpt_stream *)0x0) {
        iVar4 = mpt_stream_sync(srm,uVar8,(mpt_array *)(out + 6),timeout);
        return iVar4;
      }
      unaff_R12D = -1;
    }
    else {
      local_60 = out + 6;
      do {
        if (((ulong)out[4]._vptr & 0x2000000000) == 0) {
          local_50.events = 1;
          local_50.fd = *(int *)&out[4]._vptr;
          iVar2 = poll(&local_50,1,timeout);
          bVar14 = false;
          iVar4 = -4;
          if (-1 < iVar2) {
            if (iVar2 == 0) {
              iVar4 = 0;
            }
            else {
              iVar2 = mpt_outdata_recv(local_58);
              if (iVar2 < 0) {
                bVar14 = false;
                mpt_log(0,"remoteSync",3,"%s: %s","receive failed","unable to get new data");
              }
              else {
                timeout = 0;
                bVar14 = true;
                iVar4 = unaff_R12D;
              }
            }
          }
          unaff_R12D = iVar4;
          if (bVar14) goto LAB_00104536;
LAB_001045d7:
          bVar14 = false;
          goto LAB_00104681;
        }
LAB_00104536:
        p_Var1 = out[3]._vptr;
        if (p_Var1 == (_mpt_vptr_output *)0x0) {
LAB_00104553:
          pcVar10 = "remoteSync";
          pcVar6 = "%s: %s";
          pcVar11 = "bad message size";
          pcVar12 = "unable to get new data";
LAB_00104578:
          mpt_log(0,pcVar10,3,pcVar6,pcVar11,pcVar12);
LAB_0010457f:
          bVar14 = false;
          unaff_R12D = -2;
        }
        else {
          uVar13 = (ulong)*(byte *)((long)&out[4]._vptr + 5);
          uVar8 = (ulong)*(byte *)((long)&out[4]._vptr + 6);
          if (p_Var1[1].push < (_func_ssize_t_mpt_output_ptr_size_t_void_ptr *)(uVar8 + uVar13))
          goto LAB_00104553;
          if (*(char *)((long)&p_Var1[1].sync + uVar8) < '\0') {
            pbVar9 = (byte *)((long)&out[4]._vptr + 4);
            *pbVar9 = *pbVar9 & 0xdf;
            pbVar9 = (byte *)((long)&p_Var1[1].sync + uVar8);
            *pbVar9 = *pbVar9 & 0x7f;
            uVar3 = mpt_message_buf2id(pbVar9,uVar13,&local_68);
            if (uVar3 < 9) {
              lVar5 = mpt_command_get(local_60,local_68);
              if (lVar5 != 0) {
                local_48 = pbVar9 + uVar13;
                local_50 = (pollfd)((long)p_Var1[1].push - uVar13);
                local_40 = 0;
                uStack_38 = 0;
                iVar4 = (**(code **)(lVar5 + 8))(*(undefined8 *)(lVar5 + 0x10),&local_50);
                bVar14 = -1 < iVar4;
                if (!bVar14) {
                  unaff_R12D = 0;
                }
                goto LAB_00104681;
              }
              pcVar10 = "mpt::output::sync";
              pcVar6 = "%s (%lx)";
              pcVar11 = "bad reply id";
              pcVar12 = local_68;
              goto LAB_00104578;
            }
            mpt_log(0,"mpt::output::sync",3,"%s (%i)","bad message id",uVar3);
            goto LAB_0010457f;
          }
          p_Var1 = out[6]._vptr;
          if ((p_Var1 != (_mpt_vptr_output *)0x0) &&
             ((_func_ssize_t_mpt_output_ptr_size_t_void_ptr *)0x17 < p_Var1[1].push)) {
            uVar8 = (ulong)p_Var1[1].push / 0x18;
            pp_Var7 = &p_Var1[1].await;
            unaff_R12D = 0;
            do {
              unaff_R12D = (unaff_R12D + 1) -
                           (uint)(*pp_Var7 ==
                                 (_func_int_mpt_output_ptr__func_int_void_ptr_mpt_message_ptr_ptr_void_ptr
                                  *)0x0);
              pp_Var7 = pp_Var7 + 3;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
            goto LAB_001045d7;
          }
          bVar14 = false;
          unaff_R12D = 0;
        }
LAB_00104681:
      } while (bVar14);
    }
  }
  return unaff_R12D;
}

Assistant:

static int remoteSync(MPT_INTERFACE(output) *out, int timeout)
{
	static const char _func[] = "mpt::output::sync";
	
	MPT_STRUCT(out_data) *od = MPT_baseaddr(out_data, out, _out);
	int pos;
	
	if (!od->con.out._idlen) {
		return 0;
	}
	if (!MPT_socket_active(&od->con.out.sock)) {
		MPT_STRUCT(stream) *srm;
		
		if (!(srm = (void *) od->con.out.buf._buf)) {
			return MPT_ERROR(BadArgument);
		}
		return mpt_stream_sync(srm, od->con.out._idlen, &od->con._wait, timeout);
	}
	while (1) {
		MPT_STRUCT(buffer) *buf;
		MPT_STRUCT(command) *ans;
		uint64_t ansid;
		uint8_t *data, idlen, smax;
		
		/* use existing data */
		if (!(od->con.out.state & MPT_OUTFLAG(Received))) {
			struct pollfd p;
			
			p.fd = od->con.out.sock._id;
			p.events = POLLIN;
			
			if ((pos = poll(&p, 1, timeout)) < 0) {
				return MPT_ERROR(BadOperation);
			}
			if (!pos) {
				return 0;
			}
			if ((pos = mpt_outdata_recv(&od->con.out)) < 0) {
				mpt_log(0, __func__, MPT_LOG(Error), "%s: %s",
				        MPT_tr("receive failed"), MPT_tr("unable to get new data"));
				return MPT_ERROR(BadOperation);
			}
			timeout = 0;
		}
		idlen = od->con.out._idlen;
		smax = od->con.out._smax;
		buf = od->con.out.buf._buf;
		data = (void *) (buf + 1);
		
		if (!buf || buf->_used < (idlen + smax)) {
			mpt_log(0, __func__, MPT_LOG(Error), "%s: %s",
			        MPT_tr("bad message size"), MPT_tr("unable to get new data"));
			return MPT_ERROR(BadValue);
		}
		data += smax;
		/* no reply message */
		if (!(data[0] & 0x80)) {
			size_t max, len;
			
			if (!(buf = od->con._wait._buf)) {
				return 0;
			}
			ans = (void *) (buf + 1);
			max = buf->_used / sizeof(*ans);
			len = 0;
			
			/* count waiting slots */
			while (max--) {
				if ((ans++)->cmd) {
					++len;
				}
			}
			return len;
		}
		od->con.out.state &= ~MPT_OUTFLAG(Received);
		data[0] &= 0x7f;
		pos = mpt_message_buf2id(data, idlen, &ansid);
		
		if (pos < 0 || pos > (int) sizeof(uintptr_t)) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("bad message id"), pos);
			return MPT_ERROR(BadValue);
		}
		if ((ans = mpt_command_get(&od->con._wait, ansid))) {
			MPT_STRUCT(message) msg;
			
			msg.base = data + idlen;
			msg.used = buf->_used - idlen;
			msg.cont = 0;
			msg.clen = 0;
			
			if (ans->cmd(ans->arg, &msg) < 0) {
				return 0;
			}
			continue;
		}
		mpt_log(0, _func, MPT_LOG(Error), "%s (%" PRIx64 ")",
		        MPT_tr("bad reply id"), ansid);
		return MPT_ERROR(BadValue);
	}
}